

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_ArenaMergeFrom_Test::TestBody
          (ExtensionSetTest_ArenaMergeFrom_Test *this)

{
  TestAllExtensions *message;
  undefined1 local_100 [8];
  TestAllExtensions message2;
  TestAllExtensions *message1;
  Arena arena1;
  ExtensionSetTest_ArenaMergeFrom_Test *this_local;
  
  arena1.impl_.first_arena_.cached_blocks_ = (CachedBlock **)this;
  Arena::Arena((Arena *)&message1);
  message = Arena::Create<proto2_unittest::TestAllExtensions>((Arena *)&message1);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>(message);
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)local_100);
  proto2_unittest::TestAllExtensions::MergeFrom((TestAllExtensions *)local_100,message);
  Arena::Reset((Arena *)&message1);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)local_100);
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_100);
  Arena::~Arena((Arena *)&message1);
  return;
}

Assistant:

TEST(ExtensionSetTest, ArenaMergeFrom) {
  Arena arena1;
  unittest::TestAllExtensions* message1 =
      Arena::Create<unittest::TestAllExtensions>(&arena1);
  TestUtil::SetAllExtensions(message1);
  unittest::TestAllExtensions message2;
  message2.MergeFrom(*message1);
  arena1.Reset();
  TestUtil::ExpectAllExtensionsSet(message2);
}